

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::EvalConstantValInt64
          (ValidationState_t *this,uint32_t id,int64_t *val)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t uVar4;
  Instruction *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type sVar6;
  uint32_t hi_word;
  uint32_t lo_word;
  Instruction *inst;
  int64_t *val_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    __assert_fail("0 && \"Instruction not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x577,
                  "bool spvtools::val::ValidationState_t::EvalConstantValInt64(uint32_t, int64_t *) const"
                 );
  }
  uVar2 = Instruction::type_id(this_00);
  bVar1 = IsIntScalarType(this,uVar2);
  if (bVar1) {
    OVar3 = Instruction::opcode(this_00);
    if (OVar3 == OpConstantNull) {
      *val = 0;
    }
    else {
      OVar3 = Instruction::opcode(this_00);
      if (OVar3 != OpConstant) {
        return false;
      }
      pvVar5 = Instruction::words(this_00);
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
      if (sVar6 == 4) {
        uVar2 = Instruction::word(this_00,3);
        *val = (long)(int)uVar2;
      }
      else {
        pvVar5 = Instruction::words(this_00);
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
        if (sVar6 != 5) {
          __assert_fail("inst->words().size() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x586,
                        "bool spvtools::val::ValidationState_t::EvalConstantValInt64(uint32_t, int64_t *) const"
                       );
        }
        uVar2 = Instruction::word(this_00,3);
        uVar4 = Instruction::word(this_00,4);
        *val = CONCAT44(uVar4,uVar2);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::EvalConstantValInt64(uint32_t id, int64_t* val) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    assert(0 && "Instruction not found");
    return false;
  }

  if (!IsIntScalarType(inst->type_id())) return false;

  if (inst->opcode() == spv::Op::OpConstantNull) {
    *val = 0;
  } else if (inst->opcode() != spv::Op::OpConstant) {
    // Spec constant values cannot be evaluated so don't consider constant for
    // static validation
    return false;
  } else if (inst->words().size() == 4) {
    *val = int32_t(inst->word(3));
  } else {
    assert(inst->words().size() == 5);
    const uint32_t lo_word = inst->word(3);
    const uint32_t hi_word = inst->word(4);
    *val = static_cast<int64_t>(uint64_t(lo_word) | uint64_t(hi_word) << 32);
  }
  return true;
}